

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

int64_t __thiscall
aeron::archive::AeronArchive::pollForDescriptors
          (AeronArchive *this,int64_t correlationId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  byte bVar1;
  element_type *peVar2;
  ClientConductor *this_00;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  long lVar6;
  shared_ptr<aeron::Subscription> *psVar7;
  size_t sVar8;
  long lVar9;
  SourcedException *this_01;
  char *pcVar10;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  nfds_t extraout_RDX_02;
  nfds_t nVar11;
  undefined1 auVar12 [16];
  allocator local_c5;
  int32_t local_c4;
  int64_t local_c0;
  long local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar6 = lVar6 + (this->messageTimeoutNs_).__r;
  local_c0 = correlationId;
  RecordingDescriptorPoller::reset
            ((this->recordingDescriptorPoller_)._M_t.
             super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             ._M_t.
             super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl
             ,correlationId,recordCount,consumer);
  nVar11 = extraout_RDX;
  local_c4 = recordCount;
  do {
    iVar4 = RecordingDescriptorPoller::poll
                      ((this->recordingDescriptorPoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                       .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                       _M_head_impl,(pollfd *)correlationId,nVar11,(int)consumer);
    iVar5 = RecordingDescriptorPoller::remainingRecordCount
                      ((this->recordingDescriptorPoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                       .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                       _M_head_impl);
    bVar3 = RecordingDescriptorPoller::isDispatchComplete
                      ((this->recordingDescriptorPoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                       .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>.
                       _M_head_impl);
    nVar11 = extraout_RDX_00;
    if (bVar3) {
      local_b8 = (long)(local_c4 - iVar5);
      bVar3 = true;
    }
    else {
      if (recordCount != iVar5) {
        auVar12 = std::chrono::_V2::system_clock::now();
        nVar11 = auVar12._8_8_;
        lVar6 = auVar12._0_8_ + (this->messageTimeoutNs_).__r;
        recordCount = iVar5;
      }
      peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2->m_conductorInvoker).m_isRunning == true) {
        this_00 = (peVar2->m_conductorInvoker).m_agent;
        DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
                  (&this_00->m_driverListenerAdapter);
        ClientConductor::onHeartbeatCheckTimeouts(this_00);
        nVar11 = extraout_RDX_01;
      }
      bVar3 = false;
      if (iVar4 < 1) {
        psVar7 = RecordingDescriptorPoller::subscription
                           ((this->recordingDescriptorPoller_)._M_t.
                            super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                            .
                            super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>
                            ._M_head_impl);
        consumer = (RecordingDescriptorConsumer *)
                   (((psVar7->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_imageList)._M_b._M_p;
        sVar8 = *(size_t *)((long)&(consumer->super__Function_base)._M_functor + 8);
        if (sVar8 != 0) {
          consumer = (RecordingDescriptorConsumer *)
                     &(*(Image **)&(consumer->super__Function_base)._M_functor)->m_isClosed;
          do {
            sVar8 = sVar8 - 1;
            bVar1 = (consumer->super__Function_base)._M_functor._M_pod_data[0];
            correlationId = CONCAT71((int7)((ulong)correlationId >> 8),bVar1);
            if ((bVar1 & 1) == 0) break;
            consumer = (RecordingDescriptorConsumer *)
                       ((long)&consumer[9].super__Function_base._M_functor + 8);
          } while (sVar8 != 0);
        }
        lVar9 = std::chrono::_V2::system_clock::now();
        if (lVar6 < lVar9) {
          this_01 = (SourcedException *)__cxa_allocate_exception(0x48);
          std::__cxx11::to_string(&local_70,local_c0);
          std::operator+(&local_50,"awaiting recording descriptors: correlationId=",&local_70);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,
                     "std::int64_t aeron::archive::AeronArchive::pollForDescriptors(std::int64_t, std::int32_t, RecordingDescriptorConsumer &&)"
                     ,"");
          pcVar10 = aeron::util::past_prefix
                              ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                              );
          std::__cxx11::string::string((string *)&local_90,pcVar10,&local_c5);
          aeron::util::SourcedException::SourcedException
                    (this_01,&local_50,&local_b0,&local_90,0x1b4);
          *(undefined ***)this_01 = &PTR__SourcedException_00163228;
          __cxa_throw(this_01,&ArchiveException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        sched_yield();
        bVar3 = false;
        nVar11 = extraout_RDX_02;
      }
    }
    if (bVar3) {
      return local_b8;
    }
  } while( true );
}

Assistant:

std::int64_t AeronArchive::pollForDescriptors(std::int64_t correlationId, std::int32_t recordCount,
                                              RecordingDescriptorConsumer&& consumer) {
    std::int32_t existingRemainCount = recordCount;
    auto deadline = Clock::now() + messageTimeoutNs_;

    recordingDescriptorPoller_->reset(correlationId, recordCount, std::move(consumer));

    while (true) {
        std::int32_t fragments = recordingDescriptorPoller_->poll();
        std::int32_t remainingRecordCount = recordingDescriptorPoller_->remainingRecordCount();

        if (recordingDescriptorPoller_->isDispatchComplete()) {
            return recordCount - remainingRecordCount;
        }

        if (existingRemainCount != remainingRecordCount) {
            existingRemainCount = remainingRecordCount;
            deadline = Clock::now() + messageTimeoutNs_;
        }

        aeron_->conductorAgentInvoker().invoke();

        if (fragments > 0) {
            continue;
        }

        if (!recordingDescriptorPoller_->subscription()->isConnected()) {
            throw ArchiveException("subscription to archive is not connected", SOURCEINFO);
        }

        if (Clock::now() > deadline) {
            throw ArchiveException("awaiting recording descriptors: correlationId=" + std::to_string(correlationId),
                                   SOURCEINFO);
        }

        idleStrategy_.idle();
    }
}